

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O2

void __thiscall VMState::SetVar(VMState *this,int pos,ExpressionPtr *exp,bool expIsStatementLike)

{
  undefined8 *puVar1;
  pointer pSVar2;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  BinaryOperatorExpression *this_00;
  ExpressionStatement *pEVar8;
  Error *this_01;
  ExpressionPtr *pEVar9;
  undefined4 in_register_00000034;
  ExpressionPtr assignExp;
  StatementPtr local_c0;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<Statement,(__gnu_cxx::_Lock_policy)2> local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<Statement,(__gnu_cxx::_Lock_policy)2> local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  pEVar9 = exp;
  if ((-1 < pos) &&
     (lVar7 = (long)(this->m_Stack).
                    super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_Stack).
                    super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>
                    ._M_impl.super__Vector_impl_data._M_start,
     pEVar9 = (ExpressionPtr *)(lVar7 % 0x28), pos < (int)(lVar7 / 0x28))) {
    std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>);
    bVar4 = InitVar(this,pos,(ExpressionPtr *)&local_40,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    if (!bVar4) {
      iVar5 = (**((exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 _vptr_Expression)();
      puVar1 = &((this->m_Stack).
                 super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>.
                 _M_impl.super__Vector_impl_data._M_start[(uint)pos].expression.
                 super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_Expression;
      if ((puVar1 == (undefined8 *)0x0) || (iVar6 = (**(code **)*puVar1)(), iVar6 != 4)) {
        if (iVar5 == 5 || expIsStatementLike) {
          pEVar8 = (ExpressionStatement *)operator_new(0x28);
          std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_80,&exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>);
          ExpressionStatement::ExpressionStatement(pEVar8,(ExpressionPtr *)&local_80);
          std::__shared_ptr<ExpressionStatement,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<ExpressionStatement,void>
                    ((__shared_ptr<ExpressionStatement,(__gnu_cxx::_Lock_policy)2> *)&assignExp,
                     pEVar8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
          std::__shared_ptr<Statement,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<ExpressionStatement,void>
                    (local_90,(__shared_ptr<ExpressionStatement,_(__gnu_cxx::_Lock_policy)2> *)
                              &assignExp);
          PushStatement(this,(StatementPtr *)local_90);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
          pSVar2 = (this->m_Stack).
                   super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::__shared_ptr<Statement,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<ExpressionStatement,void>
                    (local_a0,(__shared_ptr<ExpressionStatement,_(__gnu_cxx::_Lock_policy)2> *)
                              &assignExp);
          std::vector<std::shared_ptr<Statement>,std::allocator<std::shared_ptr<Statement>>>::
          emplace_back<std::shared_ptr<Statement>>
                    ((vector<std::shared_ptr<Statement>,std::allocator<std::shared_ptr<Statement>>>
                      *)&pSVar2[(uint)pos].pendingStatements,(shared_ptr<Statement> *)local_a0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&assignExp.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        else {
          std::vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>::
          clear(&(this->m_Stack).
                 super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>.
                 _M_impl.super__Vector_impl_data._M_start[(uint)pos].pendingStatements);
        }
        std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_b0,&exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>);
        ToTemporaryVariable(&assignExp);
        std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> *)
                   ((this->m_Stack).
                    super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>
                    ._M_impl.super__Vector_impl_data._M_start + (uint)pos),
                   &assignExp.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&assignExp.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  );
        p_Var3 = &local_b0;
      }
      else {
        this_00 = (BinaryOperatorExpression *)operator_new(0x30);
        std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_50,
                   (__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> *)
                   ((this->m_Stack).
                    super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>
                    ._M_impl.super__Vector_impl_data._M_start + (uint)pos));
        std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_60,&exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>);
        BinaryOperatorExpression::BinaryOperatorExpression
                  (this_00,0x3d,(ExpressionPtr *)&local_50,(ExpressionPtr *)&local_60);
        std::__shared_ptr<Expression,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<BinaryOperatorExpression,void>
                  ((__shared_ptr<Expression,(__gnu_cxx::_Lock_policy)2> *)&assignExp,this_00);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
        pEVar8 = (ExpressionStatement *)operator_new(0x28);
        std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_70,&assignExp.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>);
        ExpressionStatement::ExpressionStatement(pEVar8,(ExpressionPtr *)&local_70);
        std::__shared_ptr<Statement,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<ExpressionStatement,void>
                  ((__shared_ptr<Statement,(__gnu_cxx::_Lock_policy)2> *)&local_c0,pEVar8);
        PushStatement(this,&local_c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_c0.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
        p_Var3 = &assignExp.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var3->_M_refcount);
      return;
    }
    return;
  }
  this_01 = (Error *)__cxa_allocate_exception(0x28,CONCAT44(in_register_00000034,pos),pEVar9);
  Error::Error(this_01,"Accessing non valid stack position.");
  __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
}

Assistant:

void SetVar( int pos, ExpressionPtr exp, bool expIsStatementLike = false )
	{
		if (pos < 0 || pos >= (int)m_Stack.size())
			throw Error("Accessing non valid stack position.");

		if (InitVar(pos, exp))
			return;

		if (exp->IsOperator())
			expIsStatementLike = true;

		if (m_Stack[pos].expression && m_Stack[pos].expression->GetType() == Exp_LocalVariable)
		{
			// Setting value to local variable - generate statement for this
			ExpressionPtr assignExp = ExpressionPtr(new BinaryOperatorExpression('=', m_Stack[pos].expression, exp));
			PushStatement(StatementPtr(new ExpressionStatement(assignExp)));
		}
		else
		{
			// Setting to intermediate variable
			if (expIsStatementLike)
			{
				// but expression itself may be used as statement - we must put it in pending state
				// and assure that it will be invoked only once, when not by usage of temporary
				// stack register that by explicit statement
				ExpressionStatementPtr statement = ExpressionStatementPtr(new ExpressionStatement(exp));
				PushStatement(statement);

				m_Stack[pos].pendingStatements.push_back(statement);
			}
			else
			{
				m_Stack[pos].pendingStatements.clear();
			}

			m_Stack[pos].expression = ToTemporaryVariable(exp);
		}
	}